

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_charset_filter_module.c
# Opt level: O2

char * ngx_http_set_charset_slot(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  ngx_uint_t nVar1;
  void *pvVar2;
  char *__s1;
  int iVar3;
  ngx_int_t nVar4;
  ngx_str_t *name;
  undefined1 local_40 [8];
  ngx_str_t var;
  
  nVar1 = cmd->offset;
  if (*(long *)((long)conf + nVar1) != -1) {
    return "is duplicate";
  }
  pvVar2 = cf->args->elts;
  __s1 = *(char **)((long)pvVar2 + 0x18);
  if ((nVar1 == 0) && (iVar3 = strcmp(__s1,"off"), iVar3 == 0)) {
    *(undefined8 *)conf = 0xfffffffffffffffe;
  }
  else {
    name = (ngx_str_t *)((long)pvVar2 + 0x10);
    if (*__s1 != '$') {
      nVar4 = ngx_http_add_charset
                        (*(ngx_array_t **)(*cf->ctx + ngx_http_charset_filter_module.ctx_index * 8),
                         name);
      *(ngx_int_t *)((long)conf + nVar1) = nVar4;
      return (char *)-(ulong)(nVar4 == -1);
    }
    local_40 = (undefined1  [8])(name->len - 1);
    var.len = (size_t)(__s1 + 1);
    nVar4 = ngx_http_get_variable_index(cf,(ngx_str_t *)local_40);
    *(ngx_int_t *)((long)conf + nVar1) = nVar4;
    if (nVar4 == -1) {
      return (char *)0xffffffffffffffff;
    }
    *(ngx_int_t *)((long)conf + nVar1) = nVar4 + 0x10000;
  }
  return (char *)0x0;
}

Assistant:

static char *
ngx_http_set_charset_slot(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    char  *p = conf;

    ngx_int_t                     *cp;
    ngx_str_t                     *value, var;
    ngx_http_charset_main_conf_t  *mcf;

    cp = (ngx_int_t *) (p + cmd->offset);

    if (*cp != NGX_CONF_UNSET) {
        return "is duplicate";
    }

    value = cf->args->elts;

    if (cmd->offset == offsetof(ngx_http_charset_loc_conf_t, charset)
        && ngx_strcmp(value[1].data, "off") == 0)
    {
        *cp = NGX_HTTP_CHARSET_OFF;
        return NGX_CONF_OK;
    }


    if (value[1].data[0] == '$') {
        var.len = value[1].len - 1;
        var.data = value[1].data + 1;

        *cp = ngx_http_get_variable_index(cf, &var);

        if (*cp == NGX_ERROR) {
            return NGX_CONF_ERROR;
        }

        *cp += NGX_HTTP_CHARSET_VAR;

        return NGX_CONF_OK;
    }

    mcf = ngx_http_conf_get_module_main_conf(cf,
                                             ngx_http_charset_filter_module);

    *cp = ngx_http_add_charset(&mcf->charsets, &value[1]);
    if (*cp == NGX_ERROR) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}